

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O1

void __thiscall Pl_DCT::decompress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  Pipeline *pPVar2;
  undefined8 *puVar3;
  size_t sVar4;
  uchar *puVar5;
  runtime_error *this_00;
  uint uVar6;
  jpeg_progress_mgr progress_mgr;
  code *local_48 [4];
  
  jpeg_CreateDecompress(cinfo_p,0x50,0x290);
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    *(ulong *)(*(long *)((long)cinfo_p + 8) + 0x58) = (anonymous_namespace)::memory_limit;
  }
  puVar3 = (undefined8 *)(*(code *)**(undefined8 **)((long)cinfo_p + 8))(cinfo_p,0,0x38);
  *(undefined8 **)((long)cinfo_p + 0x28) = puVar3;
  puVar3[2] = init_buffer_source;
  puVar3[3] = fill_buffer_input_buffer;
  puVar3[4] = skip_buffer_input_data;
  puVar3[5] = jpeg_resync_to_restart;
  puVar3[6] = term_buffer_source;
  sVar4 = Buffer::getSize(b);
  puVar3[1] = sVar4;
  puVar5 = Buffer::getBuffer(b);
  *puVar3 = puVar5;
  jpeg_read_header(cinfo_p,1);
  jpeg_calc_output_dimensions(cinfo_p);
  iVar1 = *(int *)((long)cinfo_p + 0x88);
  if (*(int *)((long)cinfo_p + 0x94) < 0) {
    QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(*(int *)((long)cinfo_p + 0x94));
  }
  uVar6 = iVar1 * *(int *)((long)cinfo_p + 0x94);
  if (0 < (long)(anonymous_namespace)::memory_limit) {
    if ((anonymous_namespace)::memory_limit / (uint)(*(int *)((long)cinfo_p + 0x8c) * 0x14) <
        (ulong)uVar6) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Pl_DCT::decompress: JPEG data large - may be too slow");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (0 < (anonymous_namespace)::scan_limit) {
    local_48[0] = progress_monitor;
    *(code ***)((long)cinfo_p + 0x10) = local_48;
  }
  puVar3 = (undefined8 *)(**(code **)(*(long *)((long)cinfo_p + 8) + 0x10))(cinfo_p,1,uVar6,1);
  jpeg_start_decompress(cinfo_p);
  while (*(uint *)((long)cinfo_p + 0xa8) < *(uint *)((long)cinfo_p + 0x8c)) {
    jpeg_read_scanlines(cinfo_p,puVar3,1);
    pPVar2 = (this->super_Pipeline).next_;
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,*puVar3,(ulong)uVar6);
  }
  jpeg_finish_decompress(cinfo_p);
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_DCT::decompress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_decompress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_decompress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif

    if (memory_limit > 0) {
        cinfo->mem->max_memory_to_use = memory_limit;
    }

    jpeg_buffer_src(cinfo, b);

    (void)jpeg_read_header(cinfo, TRUE);
    (void)jpeg_calc_output_dimensions(cinfo);
    unsigned int width = cinfo->output_width * QIntC::to_uint(cinfo->output_components);
    if (memory_limit > 0 &&
        width > (static_cast<unsigned long>(memory_limit) / (20U * cinfo->output_height))) {
        // Even if jpeglib does not run out of memory, qpdf will while buffering the data before
        // writing it. Furthermore, for very large images runtime can be significant before the
        // first warning is encountered causing a timeout in oss-fuzz.
        throw std::runtime_error("Pl_DCT::decompress: JPEG data large - may be too slow");
    }
    jpeg_progress_mgr progress_mgr;
    if (scan_limit > 0) {
        progress_mgr.progress_monitor = &progress_monitor;
        cinfo->progress = &progress_mgr;
    }
    JSAMPARRAY buffer =
        (*cinfo->mem->alloc_sarray)(reinterpret_cast<j_common_ptr>(cinfo), JPOOL_IMAGE, width, 1);

    (void)jpeg_start_decompress(cinfo);
    while (cinfo->output_scanline < cinfo->output_height) {
        (void)jpeg_read_scanlines(cinfo, buffer, 1);
        next()->write(buffer[0], width * sizeof(buffer[0][0]));
    }
    (void)jpeg_finish_decompress(cinfo);
    next()->finish();
}